

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O3

void inv_txfm2d_add_facade
               (int32_t *input,uint16_t *output,int stride,int32_t *txfm_buf,TX_TYPE tx_type,
               TX_SIZE tx_size,int bd)

{
  int32_t *piVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  ushort *puVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  int32_t *piVar21;
  char cVar22;
  int iVar23;
  ulong uVar24;
  int8_t stage_range_row [12];
  TXFM_2D_FLIP_CFG cfg;
  code *local_e0;
  ushort *local_b8;
  code *local_a0;
  int8_t local_88 [12];
  int8_t local_7c [12];
  TXFM_2D_FLIP_CFG local_70;
  
  av1_get_inv_txfm_cfg(tx_type,tx_size,&local_70);
  uVar17 = tx_size_wide[local_70.tx_size];
  lVar12 = (long)(int)uVar17;
  uVar2 = tx_size_high[local_70.tx_size];
  iVar23 = 0;
  if (uVar17 != uVar2) {
    if ((int)uVar2 < (int)uVar17) {
      iVar23 = 1;
      if ((uVar2 * 2 == uVar17) || (iVar23 = 2, uVar2 * 4 == uVar17)) goto LAB_003853d2;
    }
    else {
      iVar23 = -1;
      if ((uVar17 * 2 == uVar2) || (iVar23 = -2, uVar17 * 4 == uVar2)) goto LAB_003853d2;
    }
    iVar23 = 0;
  }
LAB_003853d2:
  local_a0 = (code *)0x0;
  av1_gen_inv_stage_range(local_88,local_7c,&local_70,'\0',bd);
  if ((ulong)local_70.txfm_type_col < 0xc) {
    local_a0 = (code *)(&PTR_av1_idct4_005cdf90)[local_70.txfm_type_col];
  }
  if ((ulong)local_70.txfm_type_row < 0xc) {
    local_e0 = (code *)(&PTR_av1_idct4_005cdf90)[local_70.txfm_type_row];
  }
  else {
    local_e0 = (code *)0x0;
  }
  uVar8 = uVar17;
  if ((int)uVar17 < (int)uVar2) {
    uVar8 = uVar2;
  }
  lVar3 = (long)(int)uVar8;
  iVar7 = -iVar23;
  if (0 < iVar23) {
    iVar7 = iVar23;
  }
  cVar22 = (char)bd + '\b';
  lVar14 = 1L << ((char)bd + 7U & 0x3f);
  piVar1 = txfm_buf + lVar3;
  piVar21 = piVar1 + lVar3;
  lVar6 = lVar14 + -1;
  lVar15 = -lVar14;
  uVar19 = 1;
  if (1 < (int)uVar17) {
    uVar19 = (ulong)uVar17;
  }
  uVar24 = 1;
  if (1 < (int)uVar2) {
    uVar24 = (ulong)uVar2;
  }
  uVar13 = 0;
  do {
    if (iVar7 == 1) {
      uVar9 = 0;
      piVar4 = input;
      do {
        txfm_buf[uVar9] = (int32_t)((long)*piVar4 * 0xb50 + 0x800U >> 0xc);
        uVar9 = uVar9 + 1;
        piVar4 = piVar4 + (int)uVar2;
      } while (uVar19 != uVar9);
      uVar9 = 0;
      do {
        iVar23 = txfm_buf[uVar9];
        if ('\0' < cVar22) {
          lVar10 = (long)txfm_buf[uVar9];
          lVar11 = lVar6;
          if (lVar10 < lVar6) {
            lVar11 = lVar10;
          }
          iVar23 = (int)lVar15;
          if (SBORROW8(lVar10,lVar15) == lVar10 + lVar14 < 0) {
            iVar23 = (int)lVar11;
          }
        }
        txfm_buf[uVar9] = iVar23;
        uVar9 = uVar9 + 1;
      } while (uVar17 != uVar9);
    }
    else {
      uVar9 = 0;
      piVar4 = input;
      do {
        txfm_buf[uVar9] = *piVar4;
        uVar9 = uVar9 + 1;
        piVar4 = piVar4 + (int)uVar2;
      } while (uVar19 != uVar9);
      uVar9 = 0;
      do {
        iVar23 = txfm_buf[uVar9];
        if ('\0' < cVar22) {
          lVar10 = (long)txfm_buf[uVar9];
          lVar11 = lVar6;
          if (lVar10 < lVar6) {
            lVar11 = lVar10;
          }
          iVar23 = (int)lVar15;
          if (SBORROW8(lVar10,lVar15) == lVar10 + lVar14 < 0) {
            iVar23 = (int)lVar11;
          }
        }
        txfm_buf[uVar9] = iVar23;
        uVar9 = uVar9 + 1;
      } while (uVar17 != uVar9);
    }
    (*local_e0)(txfm_buf,piVar21,(int)local_70.cos_bit_row,local_7c);
    (*av1_round_shift_array)(piVar21,uVar17,-(int)*local_70.shift);
    piVar21 = piVar21 + lVar12;
    uVar13 = uVar13 + 1;
    input = input + 1;
  } while (uVar13 != uVar24);
  iVar23 = 10;
  if (10 < bd) {
    iVar23 = bd;
  }
  lVar14 = 1L << ((char)iVar23 + 5U & 0x3f);
  uVar13 = 0;
  lVar6 = lVar3 * 2;
  local_b8 = output;
  do {
    uVar17 = uVar17 - 1;
    if (local_70.lr_flip == 0) {
      uVar9 = 0;
      lVar15 = lVar6;
      do {
        txfm_buf[uVar9] = txfm_buf[lVar15];
        uVar9 = uVar9 + 1;
        lVar15 = lVar15 + lVar12;
      } while (uVar24 != uVar9);
    }
    else {
      lVar15 = (long)(int)uVar17 + lVar3 * 2;
      uVar9 = 0;
      do {
        txfm_buf[uVar9] = txfm_buf[lVar15];
        uVar9 = uVar9 + 1;
        lVar15 = lVar15 + lVar12;
      } while (uVar24 != uVar9);
    }
    uVar9 = 0;
    do {
      iVar7 = txfm_buf[uVar9];
      if ('\0' < (char)((char)iVar23 + '\x06')) {
        lVar11 = (long)txfm_buf[uVar9];
        lVar15 = lVar14 + -1;
        if (lVar11 < lVar14 + -1) {
          lVar15 = lVar11;
        }
        iVar7 = (int)-lVar14;
        if (SBORROW8(lVar11,-lVar14) == lVar11 + lVar14 < 0) {
          iVar7 = (int)lVar15;
        }
      }
      txfm_buf[uVar9] = iVar7;
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
    (*local_a0)(txfm_buf,piVar1,(int)local_70.cos_bit_col,local_88);
    (*av1_round_shift_array)(piVar1,uVar2,-(int)local_70.shift[1]);
    puVar5 = local_b8;
    uVar9 = uVar24;
    uVar8 = uVar2;
    if (local_70.ud_flip == 0) {
      uVar9 = 0;
      do {
        uVar8 = (uint)*puVar5 + piVar1[uVar9];
        if (bd == 10) {
          uVar20 = 0x3ff;
        }
        else if (bd == 0xc) {
          uVar20 = 0xfff;
        }
        else {
          uVar20 = 0xff;
        }
        if (uVar8 < uVar20) {
          uVar20 = uVar8;
        }
        uVar16 = (ushort)uVar20;
        if ((int)uVar8 < 0) {
          uVar16 = 0;
        }
        *puVar5 = uVar16;
        uVar9 = uVar9 + 1;
        puVar5 = puVar5 + stride;
      } while (uVar24 != uVar9);
    }
    else {
      do {
        uVar8 = uVar8 - 1;
        uVar20 = (uint)*puVar5 + piVar1[(int)uVar8];
        if (bd == 10) {
          uVar18 = 0x3ff;
        }
        else if (bd == 0xc) {
          uVar18 = 0xfff;
        }
        else {
          uVar18 = 0xff;
        }
        if (uVar20 < uVar18) {
          uVar18 = uVar20;
        }
        uVar16 = (ushort)uVar18;
        if ((int)uVar20 < 0) {
          uVar16 = 0;
        }
        *puVar5 = uVar16;
        puVar5 = puVar5 + stride;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    uVar13 = uVar13 + 1;
    lVar6 = lVar6 + 1;
    local_b8 = local_b8 + 1;
  } while (uVar13 != uVar19);
  return;
}

Assistant:

static inline void inv_txfm2d_add_facade(const int32_t *input, uint16_t *output,
                                         int stride, int32_t *txfm_buf,
                                         TX_TYPE tx_type, TX_SIZE tx_size,
                                         int bd) {
  TXFM_2D_FLIP_CFG cfg;
  av1_get_inv_txfm_cfg(tx_type, tx_size, &cfg);
  // Forward shift sum uses larger square size, to be consistent with what
  // av1_gen_inv_stage_range() does for inverse shifts.
  inv_txfm2d_add_c(input, output, stride, &cfg, txfm_buf, tx_size, bd);
}